

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmChk<(moira::Instr)32,(moira::Mode)7,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  StrWriter *pSVar3;
  Moira *this_00;
  Av<(moira::Instr)32,_(moira::Mode)7,_4> local_40;
  Ea<(moira::Mode)7,_4> src;
  
  uVar1 = *addr;
  src.reg = op & 7;
  this_00 = this;
  src.pc = uVar1;
  src.ext1 = dasmIncRead<2>(this,addr);
  if (str->style->syntax != MUSASHI) {
    bVar2 = isAvailable(this_00,this->dasmModel,CHK,AW,4);
    if (!bVar2) {
      *addr = uVar1;
      dasmIllegal<(moira::Instr)32,(moira::Mode)7,4>(this,str,addr,op);
      return;
    }
  }
  pSVar3 = StrWriter::operator<<(str);
  pSVar3 = StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar3,&src);
  StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Dn)(op >> 9 & 7));
  local_40.ext1 = 0;
  StrWriter::operator<<(str,&local_40);
  return;
}

Assistant:

void
Moira::dasmChk(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    if (str.style.syntax != Syntax::MUSASHI && !isAvailable(dasmModel, I, M, S)) {

        addr = old;
        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    str << Av<I, M, S>{};
}